

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall
IMLE<1,_1,_FastLinearExpert>::predictInverse(IMLE<1,_1,_FastLinearExpert> *this,X *x)

{
  bool bVar1;
  Scalar *pSVar2;
  Index in_RDI;
  int worseSol;
  int newSol2;
  int newSol1;
  IMLE<1,_1,_FastLinearExpert> *in_stack_000001b0;
  X *in_stack_000002b8;
  IMLE<1,_1,_FastLinearExpert> *in_stack_000002c0;
  int in_stack_00000404;
  int in_stack_00000408;
  int in_stack_0000040c;
  IMLE<1,_1,_FastLinearExpert> *in_stack_00000410;
  int *in_stack_00000420;
  int *in_stack_00000428;
  int *in_stack_00000430;
  IMLE<1,_1,_FastLinearExpert> *in_stack_00000438;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffffe0;
  
  predictInverseSingle(in_stack_000002c0,in_stack_000002b8);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_ffffffffffffffe0,in_RDI);
  if (((*pSVar2 != 0.0) || (NAN(*pSVar2))) &&
     ((*(double *)(in_RDI + 0x60) != 0.0 || (NAN(*(double *)(in_RDI + 0x60)))))) {
    while (bVar1 = validInverseSolutions
                             (in_stack_00000438,in_stack_00000430,in_stack_00000428,
                              in_stack_00000420), ((bVar1 ^ 0xffU) & 1) != 0) {
      *(int *)(in_RDI + 0x328) = *(int *)(in_RDI + 0x328) + 1;
      clusterInverseSolutions
                (in_stack_00000410,in_stack_0000040c,in_stack_00000408,in_stack_00000404);
      getInverseSolutions(in_stack_000001b0);
    }
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverse(X const &x)
{
    predictInverseSingle(x);

    if( sum_p_x(0) == 0.0 || param.multiValuedSignificance == 0.0)
        return;

    int newSol1, newSol2, worseSol;
    while( !validInverseSolutions(newSol1, newSol2, worseSol) )
    {
        nInvSolFound++;
        clusterInverseSolutions(newSol1, newSol2, worseSol);
        getInverseSolutions();
    }
}